

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_binding_resolver.cpp
# Opt level: O1

unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
* duckdb::ColumnBindingResolver::VerifyInternal
            (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             *__return_storage_ptr__,LogicalOperator *op)

{
  ulong uVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  type op_00;
  __node_base_ptr p_Var4;
  InternalException *pIVar5;
  ulong uVar6;
  __hashtable *__h;
  __node_base_ptr p_Var7;
  _Hash_node_base *p_Var8;
  _Alloc_hider _Var9;
  pointer this;
  unsigned_long index;
  vector<unsigned_long,_true> indexes;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  child_indexes;
  _Hash_node_base *local_a0;
  string local_98;
  LogicalOperator *local_78;
  pointer local_70;
  undefined1 local_68 [56];
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  this = (op->children).
         super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  local_70 = (op->children).
             super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_78 = op;
  if (this != local_70) {
    do {
      op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator*(this);
      VerifyInternal((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)local_68,op_00);
      for (p_Var8 = (_Hash_node_base *)local_68._16_8_; p_Var8 != (_Hash_node_base *)0x0;
          p_Var8 = p_Var8->_M_nxt) {
        local_a0 = p_Var8[1]._M_nxt;
        uVar1 = (__return_storage_ptr__->_M_h)._M_bucket_count;
        uVar6 = (ulong)local_a0 % uVar1;
        p_Var2 = (__return_storage_ptr__->_M_h)._M_buckets[uVar6];
        p_Var4 = (__node_base_ptr)0x0;
        if ((p_Var2 != (__node_base_ptr)0x0) &&
           (p_Var4 = p_Var2, p_Var7 = p_Var2->_M_nxt, local_a0 != p_Var2->_M_nxt[1]._M_nxt)) {
          while (p_Var3 = p_Var7->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
            p_Var4 = (__node_base_ptr)0x0;
            if (((ulong)p_Var3[1]._M_nxt % uVar1 != uVar6) ||
               (p_Var4 = p_Var7, p_Var7 = p_Var3, local_a0 == p_Var3[1]._M_nxt)) goto LAB_0046f2c6;
          }
          p_Var4 = (__node_base_ptr)0x0;
        }
LAB_0046f2c6:
        if ((p_Var4 != (__node_base_ptr)0x0) && (p_Var4->_M_nxt != (_Hash_node_base *)0x0)) {
          pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,"Duplicate table index \"%lld\" found","");
          InternalException::InternalException<unsigned_long>
                    (pIVar5,&local_98,(unsigned_long)local_a0);
          __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_98._M_dataplus._M_p = (pointer)__return_storage_ptr__;
        ::std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)__return_storage_ptr__,&local_a0,&local_98);
      }
      ::std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_68);
      this = this + 1;
    } while (this != local_70);
  }
  (*local_78->_vptr_LogicalOperator[0xd])(&local_98);
  if (local_98._M_dataplus._M_p != (pointer)local_98._M_string_length) {
    _Var9._M_p = local_98._M_dataplus._M_p;
    do {
      local_a0 = *(_Hash_node_base **)_Var9._M_p;
      uVar1 = (__return_storage_ptr__->_M_h)._M_bucket_count;
      uVar6 = (ulong)local_a0 % uVar1;
      p_Var2 = (__return_storage_ptr__->_M_h)._M_buckets[uVar6];
      p_Var4 = (__node_base_ptr)0x0;
      if ((p_Var2 != (__node_base_ptr)0x0) &&
         (p_Var4 = p_Var2, p_Var7 = p_Var2->_M_nxt, local_a0 != p_Var2->_M_nxt[1]._M_nxt)) {
        while (p_Var8 = p_Var7->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
          p_Var4 = (__node_base_ptr)0x0;
          if (((ulong)p_Var8[1]._M_nxt % uVar1 != uVar6) ||
             (p_Var4 = p_Var7, p_Var7 = p_Var8, local_a0 == p_Var8[1]._M_nxt)) goto LAB_0046f397;
        }
        p_Var4 = (__node_base_ptr)0x0;
      }
LAB_0046f397:
      if ((p_Var4 != (__node_base_ptr)0x0) && (p_Var4->_M_nxt != (_Hash_node_base *)0x0)) {
        pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
        local_68._0_8_ = local_68 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_68,"Duplicate table index \"%lld\" found","");
        InternalException::InternalException<unsigned_long>
                  (pIVar5,(string *)local_68,(unsigned_long)local_a0);
        __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_68._0_8_ = __return_storage_ptr__;
      ::std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)__return_storage_ptr__,&local_a0,local_68);
      _Var9._M_p = _Var9._M_p + 8;
    } while (_Var9._M_p != (pointer)local_98._M_string_length);
  }
  if ((size_type *)local_98._M_dataplus._M_p != (size_type *)0x0) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

unordered_set<idx_t> ColumnBindingResolver::VerifyInternal(LogicalOperator &op) {
	unordered_set<idx_t> result;
	for (auto &child : op.children) {
		auto child_indexes = VerifyInternal(*child);
		for (auto index : child_indexes) {
			D_ASSERT(index != DConstants::INVALID_INDEX);
			if (result.find(index) != result.end()) {
				throw InternalException("Duplicate table index \"%lld\" found", index);
			}
			result.insert(index);
		}
	}
	auto indexes = op.GetTableIndex();
	for (auto index : indexes) {
		D_ASSERT(index != DConstants::INVALID_INDEX);
		if (result.find(index) != result.end()) {
			throw InternalException("Duplicate table index \"%lld\" found", index);
		}
		result.insert(index);
	}
	return result;
}